

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O1

FT_Error t1_allocate_blend(T1_Face face,FT_UInt num_designs,FT_UInt num_axis)

{
  FT_Memory memory;
  bool bVar1;
  PS_Blend pPVar2;
  PS_FontInfo pPVar3;
  PS_Private pPVar4;
  FT_BBox *pFVar5;
  ulong uVar6;
  long lVar7;
  FT_Error error;
  FT_Error local_3c;
  ulong local_38;
  
  memory = (face->root).memory;
  local_3c = 0;
  pPVar2 = face->blend;
  if (pPVar2 == (PS_Blend)0x0) {
    pPVar2 = (PS_Blend)ft_mem_alloc(memory,0x300,&local_3c);
    if (local_3c != 0) {
      return local_3c;
    }
    pPVar2->num_default_design_vector = 0;
    pPVar2->design_pos[0] = (FT_Fixed *)0x0;
    pPVar2->weight_vector = (FT_Fixed *)0x0;
    pPVar2->default_weight_vector = (FT_Fixed *)0x0;
    face->blend = pPVar2;
  }
  if (num_designs != 0) {
    if (pPVar2->num_designs == 0) {
      local_38 = (ulong)num_designs;
      pPVar3 = (PS_FontInfo)ft_mem_realloc(memory,0x38,0,local_38,(void *)0x0,&local_3c);
      pPVar2->font_infos[1] = pPVar3;
      bVar1 = true;
      if (local_3c == 0) {
        pPVar4 = (PS_Private)ft_mem_realloc(memory,0xe0,0,local_38,(void *)0x0,&local_3c);
        pPVar2->privates[1] = pPVar4;
        if (local_3c == 0) {
          pFVar5 = (FT_BBox *)ft_mem_realloc(memory,0x20,0,local_38,(void *)0x0,&local_3c);
          pPVar2->bboxes[1] = pFVar5;
          bVar1 = true;
          if (local_3c == 0) {
            pPVar2->font_infos[0] = &(face->type1).font_info;
            pPVar2->privates[0] = &(face->type1).private_dict;
            pPVar2->bboxes[0] = &(face->type1).font_bbox;
            if (num_designs != 1) {
              uVar6 = 3;
              if (3 < num_designs + 1) {
                uVar6 = (ulong)(num_designs + 1);
              }
              pFVar5 = pPVar2->bboxes[1];
              lVar7 = 0;
              do {
                pFVar5 = pFVar5 + 1;
                pPVar2->font_infos[lVar7 + 2] = pPVar2->font_infos[lVar7 + 1] + 1;
                pPVar2->privates[lVar7 + 2] = pPVar2->privates[lVar7 + 1] + 1;
                pPVar2->bboxes[lVar7 + 2] = pFVar5;
                lVar7 = lVar7 + 1;
              } while (uVar6 - 2 != lVar7);
            }
            pPVar2->num_designs = num_designs;
            bVar1 = false;
          }
        }
        else {
          bVar1 = true;
        }
      }
      if (num_axis == 0 || bVar1) {
        return local_3c;
      }
      goto LAB_00266ede;
    }
    if (pPVar2->num_designs != num_designs) {
      return 3;
    }
  }
  if (num_axis == 0) {
    return local_3c;
  }
LAB_00266ede:
  if (pPVar2->num_axis != 0 && pPVar2->num_axis != num_axis) {
    return 3;
  }
  pPVar2->num_axis = num_axis;
  return local_3c;
}

Assistant:

static FT_Error
  t1_allocate_blend( T1_Face  face,
                     FT_UInt  num_designs,
                     FT_UInt  num_axis )
  {
    PS_Blend   blend;
    FT_Memory  memory = face->root.memory;
    FT_Error   error  = FT_Err_Ok;


    blend = face->blend;
    if ( !blend )
    {
      if ( FT_NEW( blend ) )
        goto Exit;

      blend->num_default_design_vector = 0;
      blend->weight_vector             = NULL;
      blend->default_weight_vector     = NULL;
      blend->design_pos[0]             = NULL;

      face->blend = blend;
    }

    /* allocate design data if needed */
    if ( num_designs > 0 )
    {
      if ( blend->num_designs == 0 )
      {
        FT_UInt  nn;


        /* allocate the blend `private' and `font_info' dictionaries */
        if ( FT_NEW_ARRAY( blend->font_infos[1], num_designs ) ||
             FT_NEW_ARRAY( blend->privates  [1], num_designs ) ||
             FT_NEW_ARRAY( blend->bboxes    [1], num_designs ) )
          goto Exit;

        blend->font_infos[0] = &face->type1.font_info;
        blend->privates  [0] = &face->type1.private_dict;
        blend->bboxes    [0] = &face->type1.font_bbox;

        for ( nn = 2; nn <= num_designs; nn++ )
        {
          blend->font_infos[nn] = blend->font_infos[nn - 1] + 1;
          blend->privates  [nn] = blend->privates  [nn - 1] + 1;
          blend->bboxes    [nn] = blend->bboxes    [nn - 1] + 1;
        }

        blend->num_designs = num_designs;
      }
      else if ( blend->num_designs != num_designs )
        goto Fail;
    }

    /* allocate axis data if needed */
    if ( num_axis > 0 )
    {
      if ( blend->num_axis != 0 && blend->num_axis != num_axis )
        goto Fail;

      blend->num_axis = num_axis;
    }

  Exit:
    return error;

  Fail:
    error = FT_THROW( Invalid_File_Format );
    goto Exit;
  }